

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O1

int SaveCfgublox(UBLOX *publox)

{
  int iVar1;
  uchar CK_B;
  ssize_t sVar2;
  int i;
  long lVar3;
  uchar CK_A;
  uint uVar4;
  ulong uVar5;
  char local_38 [20];
  char local_24;
  
  local_38[0] = -0x4b;
  local_38[1] = 'b';
  local_38[2] = '\x06';
  local_38[3] = '\t';
  local_38[4] = '\r';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\x1f';
  local_38[0xb] = '\x1f';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = 0x17;
  lVar3 = 2;
  local_24 = '\0';
  local_38[0x13] = '\0';
  do {
    local_38[0x13] = local_38[0x13] + local_38[lVar3];
    local_24 = local_24 + local_38[0x13];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x13);
  iVar1 = (publox->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (publox->RS232Port).s;
    uVar5 = 0;
    do {
      sVar2 = send(iVar1,local_38 + uVar5,(long)(0x15 - (int)uVar5),0);
      if ((int)sVar2 < 1) goto LAB_0012bbd3;
      uVar4 = (int)uVar5 + (int)sVar2;
      uVar5 = (ulong)uVar4;
    } while ((int)uVar4 < 0x15);
  }
  else {
    if (iVar1 != 0) {
LAB_0012bbd3:
      puts("Error writing data to a ublox. ");
      return 1;
    }
    iVar1 = *(int *)&(publox->RS232Port).hDev;
    uVar5 = 0;
    do {
      sVar2 = write(iVar1,local_38 + uVar5,(ulong)(0x15 - (int)uVar5));
      if ((int)sVar2 < 1) goto LAB_0012bbd3;
      uVar4 = (int)uVar5 + (int)sVar2;
      uVar5 = (ulong)uVar4;
    } while (uVar4 < 0x15);
  }
  if ((publox->bSaveRawData != 0) && ((FILE *)publox->pfSaveFile != (FILE *)0x0)) {
    fwrite(local_38,0x15,1,(FILE *)publox->pfSaveFile);
    fflush((FILE *)publox->pfSaveFile);
  }
  return 0;
}

Assistant:

inline int SaveCfgublox(UBLOX* publox)
{
	unsigned char sendbuf[32];
	int sendbuflen = 0;
	struct CFG_CFG_PL_UBX cfg_cfg_pl;

	memset(&cfg_cfg_pl, 0, sizeof(cfg_cfg_pl));	
	cfg_cfg_pl.saveMask.ioPort = 1;
	cfg_cfg_pl.saveMask.msgConf = 1;
	cfg_cfg_pl.saveMask.infMsg = 1;
	cfg_cfg_pl.saveMask.navConf = 1;
	cfg_cfg_pl.saveMask.rxmConf = 1;
	cfg_cfg_pl.saveMask.senConf = 1;
	cfg_cfg_pl.saveMask.rinvConf = 1;
	cfg_cfg_pl.saveMask.antConf = 1;
	cfg_cfg_pl.saveMask.logConf = 1;
	cfg_cfg_pl.saveMask.ftsConf = 1;
	cfg_cfg_pl.deviceMask.devBBR = 1;
	cfg_cfg_pl.deviceMask.devFlash = 1;
	cfg_cfg_pl.deviceMask.devEEPROM = 1;
	cfg_cfg_pl.deviceMask.devSpiFlash = 1;
	EncodePacketUBX(sendbuf, &sendbuflen, CFG_CLASS_UBX, CFG_CFG_ID_UBX, (unsigned char*)&cfg_cfg_pl, LEN_CFG_CFG_PL_UBX);
	//EncodePacketUBX(sendbuf, &sendbuflen, CFG_CLASS_UBX, CFG_CFG_ID_UBX, (unsigned char*)&cfg_cfg_pl, sizeof(cfg_cfg_pl));

	if (WriteAllRS232Port(&publox->RS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		printf("Error writing data to a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}

	// Should check ACK...

	return EXIT_SUCCESS;
}